

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_resampler_init(ma_resampler_config *pConfig,ma_resampler *pResampler)

{
  anon_struct_4_1_aa2af3df_for_speex aVar1;
  undefined4 uVar2;
  ma_resample_algorithm mVar3;
  undefined4 uVar4;
  ma_uint32 mVar5;
  undefined4 uVar6;
  ma_format mVar7;
  ma_uint32 mVar8;
  ma_uint32 mVar9;
  ma_uint32 mVar10;
  undefined1 local_68 [20];
  ma_uint32 mStack_54;
  undefined1 local_48 [8];
  ma_linear_resampler_config linearConfig;
  ma_result result;
  ma_resampler *pResampler_local;
  ma_resampler_config *pConfig_local;
  
  if (pResampler == (ma_resampler *)0x0) {
    pConfig_local._4_4_ = -2;
  }
  else {
    memset(pResampler,0,0x670);
    if (pConfig == (ma_resampler_config *)0x0) {
      pConfig_local._4_4_ = -2;
    }
    else if ((pConfig->format == ma_format_f32) || (pConfig->format == ma_format_s16)) {
      mVar7 = pConfig->format;
      mVar8 = pConfig->channels;
      mVar9 = pConfig->sampleRateIn;
      mVar10 = pConfig->sampleRateOut;
      mVar3 = pConfig->algorithm;
      uVar4 = *(undefined4 *)&pConfig->field_0x14;
      mVar5 = (pConfig->linear).lpfOrder;
      uVar6 = *(undefined4 *)&(pConfig->linear).field_0x4;
      aVar1.quality = (pConfig->speex).quality;
      uVar2 = *(undefined4 *)&pConfig->field_0x2c;
      (pResampler->config).linear.lpfNyquistFactor = (pConfig->linear).lpfNyquistFactor;
      (pResampler->config).speex = (anon_struct_4_1_aa2af3df_for_speex)aVar1.quality;
      *(undefined4 *)&(pResampler->config).field_0x2c = uVar2;
      (pResampler->config).algorithm = mVar3;
      *(undefined4 *)&(pResampler->config).field_0x14 = uVar4;
      (pResampler->config).linear.lpfOrder = mVar5;
      *(undefined4 *)&(pResampler->config).linear.field_0x4 = uVar6;
      (pResampler->config).format = mVar7;
      (pResampler->config).channels = mVar8;
      (pResampler->config).sampleRateIn = mVar9;
      (pResampler->config).sampleRateOut = mVar10;
      if (pConfig->algorithm == ma_resample_algorithm_linear) {
        ma_linear_resampler_config_init
                  ((ma_linear_resampler_config *)local_68,pConfig->format,pConfig->channels,
                   pConfig->sampleRateIn,pConfig->sampleRateOut);
        local_48 = (undefined1  [8])local_68._0_8_;
        linearConfig.format = local_68._8_4_;
        linearConfig.channels = local_68._12_4_;
        linearConfig.sampleRateOut = mStack_54;
        linearConfig.sampleRateIn = (pConfig->linear).lpfOrder;
        linearConfig._16_8_ = (pConfig->linear).lpfNyquistFactor;
        pConfig_local._4_4_ =
             ma_linear_resampler_init
                       ((ma_linear_resampler_config *)local_48,&(pResampler->state).linear);
        if (pConfig_local._4_4_ == 0) {
          pConfig_local._4_4_ = 0;
        }
      }
      else if (pConfig->algorithm == ma_resample_algorithm_speex) {
        pConfig_local._4_4_ = -0x67;
      }
      else {
        pConfig_local._4_4_ = -2;
      }
    }
    else {
      pConfig_local._4_4_ = -2;
    }
  }
  return pConfig_local._4_4_;
}

Assistant:

MA_API ma_result ma_resampler_init(const ma_resampler_config* pConfig, ma_resampler* pResampler)
{
    ma_result result;

    if (pResampler == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pResampler);

    if (pConfig == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pConfig->format != ma_format_f32 && pConfig->format != ma_format_s16) {
        return MA_INVALID_ARGS;
    }

    pResampler->config = *pConfig;

    switch (pConfig->algorithm)
    {
        case ma_resample_algorithm_linear:
        {
            ma_linear_resampler_config linearConfig;
            linearConfig = ma_linear_resampler_config_init(pConfig->format, pConfig->channels, pConfig->sampleRateIn, pConfig->sampleRateOut);
            linearConfig.lpfOrder         = pConfig->linear.lpfOrder;
            linearConfig.lpfNyquistFactor = pConfig->linear.lpfNyquistFactor;

            result = ma_linear_resampler_init(&linearConfig, &pResampler->state.linear);
            if (result != MA_SUCCESS) {
                return result;
            }
        } break;

        case ma_resample_algorithm_speex:
        {
        #if defined(MA_HAS_SPEEX_RESAMPLER)
            int speexErr;
            pResampler->state.speex.pSpeexResamplerState = speex_resampler_init(pConfig->channels, pConfig->sampleRateIn, pConfig->sampleRateOut, pConfig->speex.quality, &speexErr);
            if (pResampler->state.speex.pSpeexResamplerState == NULL) {
                return ma_result_from_speex_err(speexErr);
            }
        #else
            /* Speex resampler not available. */
            return MA_NO_BACKEND;
        #endif
        } break;

        default: return MA_INVALID_ARGS;
    }

    return MA_SUCCESS;
}